

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::DisconnectTip
          (Chainstate *this,BlockValidationState *state,
          DisconnectedBlockTransactions *disconnectpool)

{
  long lVar1;
  pointer ppCVar2;
  CBlockIndex *index;
  ValidationSignals *this_00;
  bool bVar3;
  DisconnectResult DVar4;
  long lVar5;
  CCoinsViewCache *baseIn;
  long lVar6;
  __node_base *p_Var7;
  shared_ptr<const_CTransaction> *evicted_tx;
  CCoinsView CVar8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  shared_ptr<CBlock> pblock;
  base_blob<256U> local_240;
  string local_220;
  CCoinsViewCache view;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar2 ==
       (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) ||
     (index = ppCVar2[-1], index == (CBlockIndex *)0x0)) {
    __assert_fail("pindexDelete",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd0,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  if (index->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindexDelete->pprev",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xbd1,
                  "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                 );
  }
  std::make_shared<CBlock>();
  bVar3 = ::node::BlockManager::ReadBlockFromDisk
                    (this->m_blockman,
                     pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,index);
  if (bVar3) {
    lVar5 = std::chrono::_V2::steady_clock::now();
    baseIn = CoinsTip(this);
    CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
    CCoinsViewCache::GetBestBlock((uint256 *)&local_220,&view);
    CBlockIndex::GetBlockHash((uint256 *)&local_240,index);
    bVar3 = ::operator==((base_blob<256U> *)&local_220,&local_240);
    if (!bVar3) {
      __assert_fail("view.GetBestBlock() == pindexDelete->GetBlockHash()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0xbdd,
                    "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                   );
    }
    DVar4 = DisconnectBlock(this,pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,index,&view);
    if (DVar4 == DISCONNECT_OK) {
      bVar3 = CCoinsViewCache::Flush(&view);
      if (!bVar3) {
        __assert_fail("flushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xbe3,
                      "bool Chainstate::DisconnectTip(BlockValidationState &, DisconnectedBlockTransactions *)"
                     );
      }
    }
    else {
      CBlockIndex::GetBlockHash((uint256 *)&local_240,index);
      base_blob<256u>::ToString_abi_cxx11_(&local_220,(base_blob<256u> *)&local_240);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "DisconnectTip";
      logging_function._M_len = 0xd;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0xbdf,ALL,Error,(ConstevalFormatString<1U>)0xcd1b96,
                 &local_220);
      std::__cxx11::string::~string((string *)&local_220);
    }
    CCoinsViewCache::~CCoinsViewCache(&view);
    if (DVar4 == DISCONNECT_OK) {
      bVar3 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar3) {
        lVar6 = std::chrono::_V2::steady_clock::now();
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar6 - lVar5) / 1000000.0);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x5e;
        logging_function_01._M_str = "DisconnectTip";
        logging_function_01._M_len = 0xd;
        LogPrintFormatInternal<double>
                  (logging_function_01,source_file_01,0xbe6,BENCH,Debug,
                   (ConstevalFormatString<1U>)0xcd1bca,(double *)&view);
      }
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView._0_4_ = index->nHeight + -1;
      p_Var7 = &(this->m_blockman->m_prune_locks)._M_h._M_before_begin;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        if ((int)view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView <
            *(int *)&p_Var7[5]._M_nxt) {
          *(int *)&p_Var7[5]._M_nxt =
               (int)view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView;
          bVar3 = ::LogAcceptCategory(PRUNE,Debug);
          if (bVar3) {
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_02._M_len = 0x5e;
            logging_function_02._M_str = "DisconnectTip";
            logging_function_02._M_len = 0xd;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_02,source_file_02,0xbef,PRUNE,Debug,
                       (ConstevalFormatString<2U>)0xcd1be6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1),(int *)&view);
          }
        }
      }
      bVar3 = FlushStateToDisk(this,state,IF_NEEDED,0);
      if (bVar3) {
        if ((disconnectpool != (DisconnectedBlockTransactions *)0x0) &&
           (this->m_mempool != (CTxMemPool *)0x0)) {
          DisconnectedBlockTransactions::AddTransactionsFromBlock
                    ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&view,disconnectpool,
                     &(pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vtx);
          for (CVar8 = view.super_CCoinsViewBacked.super_CCoinsView;
              (CCoinsView *)CVar8._vptr_CCoinsView != view.super_CCoinsViewBacked.base;
              CVar8._vptr_CCoinsView = CVar8._vptr_CCoinsView + 2) {
            CTxMemPool::removeRecursive
                      (this->m_mempool,
                       (CTransaction *)((CCoinsView *)CVar8._vptr_CCoinsView)->_vptr_CCoinsView,
                       REORG);
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)&view);
        }
        CChain::SetTip(&this->m_chain,index->pprev);
        UpdateTip(this,index->pprev);
        this_00 = (this->m_chainman->m_options).signals;
        bVar3 = true;
        if (this_00 != (ValidationSignals *)0x0) {
          std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
                    ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&view,
                     &pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
          ValidationSignals::BlockDisconnected(this_00,(shared_ptr<const_CBlock> *)&view,index);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&view.super_CCoinsViewBacked.base
                    );
        }
        goto LAB_008b2a16;
      }
    }
  }
  else {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "DisconnectTip";
    logging_function_00._M_len = 0xd;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0xbd6,ALL,Error,
               (ConstevalFormatString<0U>)0xcd1b3b);
  }
  bVar3 = false;
LAB_008b2a16:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::DisconnectTip(BlockValidationState& state, DisconnectedBlockTransactions* disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    CBlockIndex *pindexDelete = m_chain.Tip();
    assert(pindexDelete);
    assert(pindexDelete->pprev);
    // Read block from disk.
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    CBlock& block = *pblock;
    if (!m_blockman.ReadBlockFromDisk(block, *pindexDelete)) {
        LogError("DisconnectTip(): Failed to read block\n");
        return false;
    }
    // Apply the block atomically to the chain state.
    const auto time_start{SteadyClock::now()};
    {
        CCoinsViewCache view(&CoinsTip());
        assert(view.GetBestBlock() == pindexDelete->GetBlockHash());
        if (DisconnectBlock(block, pindexDelete, view) != DISCONNECT_OK) {
            LogError("DisconnectTip(): DisconnectBlock %s failed\n", pindexDelete->GetBlockHash().ToString());
            return false;
        }
        bool flushed = view.Flush();
        assert(flushed);
    }
    LogDebug(BCLog::BENCH, "- Disconnect block: %.2fms\n",
             Ticks<MillisecondsDouble>(SteadyClock::now() - time_start));

    {
        // Prune locks that began at or after the tip should be moved backward so they get a chance to reorg
        const int max_height_first{pindexDelete->nHeight - 1};
        for (auto& prune_lock : m_blockman.m_prune_locks) {
            if (prune_lock.second.height_first <= max_height_first) continue;

            prune_lock.second.height_first = max_height_first;
            LogDebug(BCLog::PRUNE, "%s prune lock moved back to %d\n", prune_lock.first, max_height_first);
        }
    }

    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }

    if (disconnectpool && m_mempool) {
        // Save transactions to re-add to mempool at end of reorg. If any entries are evicted for
        // exceeding memory limits, remove them and their descendants from the mempool.
        for (auto&& evicted_tx : disconnectpool->AddTransactionsFromBlock(block.vtx)) {
            m_mempool->removeRecursive(*evicted_tx, MemPoolRemovalReason::REORG);
        }
    }

    m_chain.SetTip(*pindexDelete->pprev);

    UpdateTip(pindexDelete->pprev);
    // Let wallets know transactions went from 1-confirmed to
    // 0-confirmed or conflicted:
    if (m_chainman.m_options.signals) {
        m_chainman.m_options.signals->BlockDisconnected(pblock, pindexDelete);
    }
    return true;
}